

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

bool __thiscall
brotli::HashLongestMatchQuickly<16,_2,_false>::FindLongestMatch
          (HashLongestMatchQuickly<16,_2,_false> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *s2;
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double local_48;
  
  sVar8 = *best_len_out;
  lVar3 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  s2 = ring_buffer + (cur_ix & ring_buffer_mask);
  uVar5 = s2[sVar8];
  local_48 = *best_score_out;
  iVar1 = *distance_cache;
  uVar7 = cur_ix - (long)iVar1;
  if ((uVar7 < cur_ix) && (uVar5 == (ring_buffer + ((uint)uVar7 & (uint)ring_buffer_mask))[sVar8]))
  {
    sVar4 = FindMatchLengthWithLimit
                      (ring_buffer + ((uint)uVar7 & (uint)ring_buffer_mask),s2,max_length);
    bVar9 = 3 < sVar4;
    if (bVar9) {
      auVar11._8_4_ = (int)(sVar4 >> 0x20);
      auVar11._0_8_ = sVar4;
      auVar11._12_4_ = 0x45300000;
      local_48 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 5.4 + 0.6;
      *best_len_out = sVar4;
      *best_len_code_out = sVar4;
      *best_distance_out = (long)iVar1;
      *best_score_out = local_48;
      uVar5 = s2[sVar4];
      sVar8 = sVar4;
    }
  }
  else {
    bVar9 = false;
  }
  for (lVar6 = 0; (int)lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar2 = this->buckets_[((ulong)(lVar3 * 0x1e35a7bd000000) >> 0x30) + lVar6];
    if ((((uVar5 == (ring_buffer + ((uint)ring_buffer_mask & uVar2))[sVar8]) && (cur_ix != uVar2))
        && (uVar7 = cur_ix - uVar2, uVar7 <= max_backward)) &&
       (sVar4 = FindMatchLengthWithLimit
                          (ring_buffer + ((uint)ring_buffer_mask & uVar2),s2,max_length), 3 < sVar4)
       ) {
      auVar12._8_4_ = (int)(sVar4 >> 0x20);
      auVar12._0_8_ = sVar4;
      auVar12._12_4_ = 0x45300000;
      iVar1 = 0x1f;
      if ((uint)uVar7 != 0) {
        for (; (uint)uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      dVar10 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 5.4 +
               (double)iVar1 * -1.2;
      if (local_48 < dVar10) {
        *best_len_out = sVar4;
        *best_len_code_out = sVar4;
        *best_distance_out = uVar7;
        *best_score_out = dVar10;
        uVar5 = s2[sVar4];
        bVar9 = true;
        sVar8 = sVar4;
        local_48 = dVar10;
      }
    }
  }
  *(uint *)((long)this->buckets_ +
           (ulong)(((uint)(ushort)((ulong)(lVar3 * 0x1e35a7bd000000) >> 0x30) +
                   (uint)(((uint)cur_ix >> 3 & 1) != 0)) * 4)) = (uint)cur_ix;
  return bVar9;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }